

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::FieldGeneratorTable::Build
          (FieldGeneratorTable *this,Options *options,MessageSCCAnalyzer *scc,
          Span<const_int> has_bit_indices,Span<const_int> inlined_string_indices)

{
  bool bVar1;
  int iVar2;
  value_type_conflict this_00;
  char *pcVar3;
  reference piVar4;
  uint *puVar5;
  int __c;
  Iterator *b;
  Iterator IVar6;
  FieldGenerator local_e8;
  uint local_98;
  _Optional_payload_base<unsigned_int> local_94;
  _Optional_payload_base<unsigned_int> local_8c;
  optional<unsigned_int> inlined_string_index;
  _Optional_payload_base<unsigned_int> local_78;
  optional<unsigned_int> has_bit_index;
  size_t index;
  FieldDescriptor *field;
  Iterator __end3;
  Iterator __begin3;
  FieldRangeImpl<google::protobuf::Descriptor> *__range3;
  MessageSCCAnalyzer *scc_local;
  Options *options_local;
  FieldGeneratorTable *this_local;
  Span<const_int> has_bit_indices_local;
  
  has_bit_indices_local.ptr_ = (pointer)has_bit_indices.len_;
  this_local = (FieldGeneratorTable *)has_bit_indices.ptr_;
  iVar2 = Descriptor::field_count(this->descriptor_);
  std::
  vector<google::protobuf::compiler::cpp::FieldGenerator,_std::allocator<google::protobuf::compiler::cpp::FieldGenerator>_>
  ::reserve(&this->fields_,(long)iVar2);
  __begin3.descriptor =
       (Descriptor *)protobuf::internal::FieldRange<google::protobuf::Descriptor>(this->descriptor_)
  ;
  IVar6 = protobuf::internal::FieldRangeImpl<google::protobuf::Descriptor>::begin
                    ((FieldRangeImpl<google::protobuf::Descriptor> *)&__begin3.descriptor);
  __begin3._0_8_ = IVar6.descriptor;
  __end3.descriptor._0_4_ = IVar6.idx;
  IVar6 = protobuf::internal::FieldRangeImpl<google::protobuf::Descriptor>::end
                    ((FieldRangeImpl<google::protobuf::Descriptor> *)&__begin3.descriptor);
  __end3._0_8_ = IVar6.descriptor;
  field._0_4_ = IVar6.idx;
  while( true ) {
    b = (Iterator *)&field;
    bVar1 = protobuf::internal::operator!=((Iterator *)&__end3.descriptor,b);
    if (!bVar1) break;
    this_00 = protobuf::internal::FieldRangeImpl<google::protobuf::Descriptor>::Iterator::operator*
                        ((Iterator *)&__end3.descriptor);
    pcVar3 = FieldDescriptor::index(this_00,(char *)b,__c);
    has_bit_index.super__Optional_base<unsigned_int,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_int> =
         (_Optional_base<unsigned_int,_true,_true>)(long)(int)pcVar3;
    std::optional<unsigned_int>::optional((optional<unsigned_int> *)&local_78);
    bVar1 = absl::lts_20240722::Span<const_int>::empty((Span<const_int> *)&this_local);
    if (!bVar1) {
      piVar4 = absl::lts_20240722::Span<const_int>::operator[]
                         ((Span<const_int> *)&this_local,
                          (size_type)
                          has_bit_index.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                          super__Optional_payload_base<unsigned_int>);
      if (-1 < *piVar4) {
        puVar5 = (uint *)absl::lts_20240722::Span<const_int>::operator[]
                                   ((Span<const_int> *)&this_local,
                                    (size_type)
                                    has_bit_index.super__Optional_base<unsigned_int,_true,_true>.
                                    _M_payload.super__Optional_payload_base<unsigned_int>);
        inlined_string_index.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_payload._M_value = *puVar5;
        std::optional<unsigned_int>::optional<unsigned_int,_true>
                  ((optional<unsigned_int> *)
                   &inlined_string_index.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_int>._M_engaged,
                   (uint *)&inlined_string_index);
        local_78 = stack0xffffffffffffff80;
      }
    }
    std::optional<unsigned_int>::optional((optional<unsigned_int> *)&local_8c);
    bVar1 = absl::lts_20240722::Span<const_int>::empty(&inlined_string_indices);
    if (!bVar1) {
      piVar4 = absl::lts_20240722::Span<const_int>::operator[]
                         (&inlined_string_indices,
                          (size_type)
                          has_bit_index.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                          super__Optional_payload_base<unsigned_int>);
      if (-1 < *piVar4) {
        puVar5 = (uint *)absl::lts_20240722::Span<const_int>::operator[]
                                   (&inlined_string_indices,
                                    (size_type)
                                    has_bit_index.super__Optional_base<unsigned_int,_true,_true>.
                                    _M_payload.super__Optional_payload_base<unsigned_int>);
        local_98 = *puVar5;
        std::optional<unsigned_int>::optional<unsigned_int,_true>
                  ((optional<unsigned_int> *)&local_94,&local_98);
        local_8c = local_94;
      }
    }
    FieldGenerator::FieldGenerator
              (&local_e8,this_00,options,scc,(optional<unsigned_int>)local_78,
               (optional<unsigned_int>)local_8c);
    std::
    vector<google::protobuf::compiler::cpp::FieldGenerator,_std::allocator<google::protobuf::compiler::cpp::FieldGenerator>_>
    ::push_back(&this->fields_,&local_e8);
    FieldGenerator::~FieldGenerator(&local_e8);
    protobuf::internal::FieldRangeImpl<google::protobuf::Descriptor>::Iterator::operator++
              ((Iterator *)&__end3.descriptor);
  }
  return;
}

Assistant:

void FieldGeneratorTable::Build(
    const Options& options, MessageSCCAnalyzer* scc,
    absl::Span<const int32_t> has_bit_indices,
    absl::Span<const int32_t> inlined_string_indices) {
  // Construct all the FieldGenerators.
  fields_.reserve(static_cast<size_t>(descriptor_->field_count()));
  for (const auto* field : internal::FieldRange(descriptor_)) {
    size_t index = static_cast<size_t>(field->index());
    absl::optional<uint32_t> has_bit_index;
    if (!has_bit_indices.empty() && has_bit_indices[index] >= 0) {
      has_bit_index = static_cast<uint32_t>(has_bit_indices[index]);
    }

    absl::optional<uint32_t> inlined_string_index;
    if (!inlined_string_indices.empty() && inlined_string_indices[index] >= 0) {
      inlined_string_index =
          static_cast<uint32_t>(inlined_string_indices[index]);
    }

    fields_.push_back(FieldGenerator(field, options, scc, has_bit_index,
                                     inlined_string_index));
  }
}